

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsRouter.cpp
# Opt level: O1

long __thiscall AmsRouter::ClosePort(AmsRouter *this,uint16_t port)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  AmsPort *this_00;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar2 == 0) {
    lVar3 = 0x748;
    if (0xff7f < (ushort)(port + 0x8a50)) {
      this_00 = (AmsPort *)(&(this->ports).field_0x0 + (ulong)(port - 30000) * 0x60);
      bVar1 = AmsPort::IsOpen(this_00);
      if (bVar1) {
        AmsPort::Close(this_00);
        lVar3 = 0;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return lVar3;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

long AmsRouter::ClosePort(uint16_t port)
{
    std::lock_guard<std::recursive_mutex> lock(mutex);
    if ((port < PORT_BASE) || (port >= PORT_BASE + NUM_PORTS_MAX) || !ports[port - PORT_BASE].IsOpen()) {
        return ADSERR_CLIENT_PORTNOTOPEN;
    }
    ports[port - PORT_BASE].Close();
    return 0;
}